

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGeneratorObjectStrings::~cmMakefileTargetGeneratorObjectStrings
          (cmMakefileTargetGeneratorObjectStrings *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->NextObject)._M_dataplus._M_p;
  paVar2 = &(this->NextObject).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->CurrentString)._M_dataplus._M_p;
  paVar2 = &(this->CurrentString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmMakefileTargetGeneratorObjectStrings(std::vector<std::string>& strings,
                                         cmOutputConverter* outputConverter,
                                         bool useWatcomQuote,
                                         cmStateDirectory const& stateDir,
                                         std::string::size_type limit)
    : Strings(strings)
    , OutputConverter(outputConverter)
    , UseWatcomQuote(useWatcomQuote)
    , StateDir(stateDir)
    , LengthLimit(limit)
  {
    this->Space = "";
  }